

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::MakeIPMStartingPointValid(LpSolver *this)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  Int j;
  double dVar8;
  double dVar9;
  
  uVar6 = (this->model_).num_cols_ + (this->model_).num_rows_;
  uVar4 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar4;
  }
  dVar9 = 0.0;
  iVar5 = 0;
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = (this->xl_start_)._M_data[uVar4];
    if ((0.0 < dVar1) && (dVar8 = (this->zl_start_)._M_data[uVar4], 0.0 < dVar8)) {
      dVar9 = dVar9 + dVar1 * dVar8;
      iVar5 = iVar5 + 1;
    }
    dVar1 = (this->xu_start_)._M_data[uVar4];
    if ((0.0 < dVar1) && (dVar8 = (this->zu_start_)._M_data[uVar4], 0.0 < dVar8)) {
      dVar9 = dVar9 + dVar1 * dVar8;
      iVar5 = iVar5 + 1;
    }
  }
  if (iVar5 == 0) {
    dVar9 = 1.0;
  }
  else {
    dVar9 = dVar9 / (double)iVar5;
  }
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    if ((ulong)ABS((this->model_).lb_._M_data[uVar4]) < 0x7ff0000000000000) {
      pdVar3 = (this->xl_start_)._M_data;
      pdVar2 = (this->zl_start_)._M_data;
      dVar1 = pdVar3[uVar4];
      dVar8 = pdVar2[uVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if ((dVar8 == 0.0) && (!NAN(dVar8))) {
          pdVar2[uVar4] = dVar9 / dVar1;
        }
      }
      else {
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = dVar9 / dVar8;
        }
        else {
          dVar8 = SQRT(dVar9);
          if (dVar9 < 0.0) {
            dVar8 = sqrt(dVar9);
          }
          (this->zl_start_)._M_data[uVar4] = dVar8;
          pdVar3 = (this->xl_start_)._M_data;
        }
        pdVar3[uVar4] = dVar8;
      }
    }
    if ((ulong)ABS((this->model_).ub_._M_data[uVar4]) < 0x7ff0000000000000) {
      pdVar3 = (this->xu_start_)._M_data;
      pdVar2 = (this->zu_start_)._M_data;
      dVar1 = pdVar3[uVar4];
      dVar8 = pdVar2[uVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if ((dVar8 == 0.0) && (!NAN(dVar8))) {
          pdVar2[uVar4] = dVar9 / dVar1;
        }
      }
      else {
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = dVar9 / dVar8;
        }
        else {
          dVar8 = SQRT(dVar9);
          if (dVar9 < 0.0) {
            dVar8 = sqrt(dVar9);
          }
          (this->zu_start_)._M_data[uVar4] = dVar8;
          pdVar3 = (this->xu_start_)._M_data;
        }
        pdVar3[uVar4] = dVar8;
      }
    }
  }
  return;
}

Assistant:

void LpSolver::MakeIPMStartingPointValid() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    Vector& xl = xl_start_;
    Vector& xu = xu_start_;
    Vector& zl = zl_start_;
    Vector& zu = zu_start_;

    Int numComplementarityProducts = 0;
    double sumComplementarityProducts = 0.0;
    for (Int j = 0; j < n+m; ++j) {
        if (xl[j] > 0.0 && zl[j] > 0.0) {
            sumComplementarityProducts += xl[j] * zl[j];
            numComplementarityProducts++;
        }
        if (xu[j] > 0.0 && zu[j] > 0.0) {
            sumComplementarityProducts += xu[j] * zu[j];
            numComplementarityProducts++;
        }
    }
    const double mu = numComplementarityProducts ?
        sumComplementarityProducts / numComplementarityProducts : 1.0;

    for (Int j = 0; j < n+m; ++j) {
        if (std::isfinite(lb[j])) {
            assert(std::isfinite(xl[j]) && xl[j] >= 0.0);
            assert(std::isfinite(zl[j]) && zl[j] >= 0.0);
            if (xl[j] == 0.0 && zl[j] == 0.0)
                xl[j] = zl[j] = std::sqrt(mu);
            else if (xl[j] == 0.0)
                xl[j] = mu / zl[j];
            else if (zl[j] == 0.0)
                zl[j] = mu / xl[j];
        } else {
            assert(xl[j] == INFINITY);
            assert(zl[j] == 0.0);
        }
        if (std::isfinite(ub[j])) {
            assert(std::isfinite(xu[j]) && xu[j] >= 0.0);
            assert(std::isfinite(zu[j]) && zu[j] >= 0.0);
            if (xu[j] == 0.0 && zu[j] == 0.0)
                xu[j] = zu[j] = std::sqrt(mu);
            else if (xu[j] == 0.0)
                xu[j] = mu / zu[j];
            else if (zu[j] == 0.0)
                zu[j] = mu / xu[j];
        } else {
            assert(xu[j] == INFINITY);
            assert(zu[j] == 0.0);
        }
    }
}